

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsedscene.h
# Opt level: O0

void __thiscall pbrt::LightSceneEntity::~LightSceneEntity(LightSceneEntity *this)

{
  long in_RDI;
  
  std::__cxx11::string::~string((string *)(in_RDI + 0x358));
  TransformedSceneEntity::~TransformedSceneEntity((TransformedSceneEntity *)0x453439);
  return;
}

Assistant:

LightSceneEntity(const std::string &name, ParameterDictionary parameters, FileLoc loc,
                     const AnimatedTransform &renderFromLight, const std::string &medium)
        : TransformedSceneEntity(name, parameters, loc, renderFromLight),
          medium(medium) {}